

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

BEGIN_HANDLE
begin_create(transfer_number next_outgoing_id_value,uint32_t incoming_window_value,
            uint32_t outgoing_window_value)

{
  int iVar1;
  BEGIN_INSTANCE_TAG BVar2;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  AMQP_VALUE item_value_01;
  int local_3c;
  int result;
  AMQP_VALUE outgoing_window_amqp_value;
  AMQP_VALUE incoming_window_amqp_value;
  AMQP_VALUE next_outgoing_id_amqp_value;
  BEGIN_INSTANCE *begin_instance;
  uint32_t outgoing_window_value_local;
  uint32_t incoming_window_value_local;
  transfer_number next_outgoing_id_value_local;
  
  next_outgoing_id_amqp_value = (AMQP_VALUE)malloc(8);
  if (next_outgoing_id_amqp_value != (AMQP_VALUE)0x0) {
    BVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x11);
    *(AMQP_VALUE *)next_outgoing_id_amqp_value = BVar2.composite_value;
    if (*(AMQP_VALUE *)next_outgoing_id_amqp_value == (AMQP_VALUE)0x0) {
      free(next_outgoing_id_amqp_value);
      next_outgoing_id_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_3c = 0;
      item_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)next_outgoing_id_amqp_value,1,item_value);
      if (iVar1 != 0) {
        local_3c = 0x8bb;
      }
      item_value_00 = amqpvalue_create_uint(incoming_window_value);
      if ((local_3c == 0) &&
         (iVar1 = amqpvalue_set_composite_item
                            (*(AMQP_VALUE *)next_outgoing_id_amqp_value,2,item_value_00), iVar1 != 0
         )) {
        local_3c = 0x8c0;
      }
      item_value_01 = amqpvalue_create_uint(outgoing_window_value);
      if ((local_3c == 0) &&
         (iVar1 = amqpvalue_set_composite_item
                            (*(AMQP_VALUE *)next_outgoing_id_amqp_value,3,item_value_01), iVar1 != 0
         )) {
        local_3c = 0x8c5;
      }
      amqpvalue_destroy(item_value);
      amqpvalue_destroy(item_value_00);
      amqpvalue_destroy(item_value_01);
      if (local_3c != 0) {
        begin_destroy((BEGIN_HANDLE)next_outgoing_id_amqp_value);
        next_outgoing_id_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (BEGIN_HANDLE)next_outgoing_id_amqp_value;
}

Assistant:

BEGIN_HANDLE begin_create(transfer_number next_outgoing_id_value, uint32_t incoming_window_value, uint32_t outgoing_window_value)
{
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)malloc(sizeof(BEGIN_INSTANCE));
    if (begin_instance != NULL)
    {
        begin_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(17);
        if (begin_instance->composite_value == NULL)
        {
            free(begin_instance);
            begin_instance = NULL;
        }
        else
        {
            AMQP_VALUE next_outgoing_id_amqp_value;
            AMQP_VALUE incoming_window_amqp_value;
            AMQP_VALUE outgoing_window_amqp_value;
            int result = 0;

            next_outgoing_id_amqp_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
            if ((result == 0) && (amqpvalue_set_composite_item(begin_instance->composite_value, 1, next_outgoing_id_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            incoming_window_amqp_value = amqpvalue_create_uint(incoming_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(begin_instance->composite_value, 2, incoming_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            outgoing_window_amqp_value = amqpvalue_create_uint(outgoing_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(begin_instance->composite_value, 3, outgoing_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(next_outgoing_id_amqp_value);
            amqpvalue_destroy(incoming_window_amqp_value);
            amqpvalue_destroy(outgoing_window_amqp_value);
            if (result != 0)
            {
                begin_destroy(begin_instance);
                begin_instance = NULL;
            }
        }
    }

    return begin_instance;
}